

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_multiplier.cpp
# Opt level: O1

Scale * __thiscall
icu_63::number::Scale::byDecimal(Scale *__return_storage_ptr__,Scale *this,StringPiece multiplicand)

{
  DecNum *pDVar1;
  Scale *p;
  StringPiece str;
  UErrorCode localError;
  LocalPointer<icu_63::number::impl::DecNum> decnum;
  UErrorCode local_2c;
  DecNum *local_28;
  
  str.length_ = multiplicand.ptr_._0_4_;
  local_2c = U_ZERO_ERROR;
  p = this;
  local_28 = (DecNum *)UMemory::operator_new((UMemory *)0x60,(size_t)this);
  if (local_28 == (DecNum *)0x0) {
    local_28 = (DecNum *)0x0;
  }
  else {
    impl::DecNum::DecNum(local_28);
  }
  if ((local_28 == (DecNum *)0x0) && (local_2c < U_ILLEGAL_ARGUMENT_ERROR)) {
    local_2c = U_MEMORY_ALLOCATION_ERROR;
  }
  if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
    str.ptr_ = (char *)this;
    str._12_4_ = 0;
    impl::DecNum::setTo(local_28,str,&local_2c);
    pDVar1 = local_28;
    p = this;
    if (local_2c < U_ILLEGAL_ARGUMENT_ERROR) {
      local_28 = (DecNum *)0x0;
      p = (Scale *)0x0;
      Scale(__return_storage_ptr__,0,pDVar1);
      goto LAB_002a9ce9;
    }
  }
  __return_storage_ptr__->fMagnitude = 0;
  __return_storage_ptr__->fArbitrary = (DecNum *)0x0;
  __return_storage_ptr__->fError = local_2c;
LAB_002a9ce9:
  pDVar1 = local_28;
  if (local_28 != (DecNum *)0x0) {
    MaybeStackHeaderAndArray<decNumber,_char,_34>::~MaybeStackHeaderAndArray(&local_28->fData);
    UMemory::operator_delete((UMemory *)pDVar1,p);
  }
  return __return_storage_ptr__;
}

Assistant:

Scale Scale::byDecimal(StringPiece multiplicand) {
    UErrorCode localError = U_ZERO_ERROR;
    LocalPointer<DecNum> decnum(new DecNum(), localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    decnum->setTo(multiplicand, localError);
    if (U_FAILURE(localError)) {
        return {localError};
    }
    return {0, decnum.orphan()};
}